

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O3

int __thiscall CDELECommand::doWhat(CDELECommand *this,CClient *pClient)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EFTPSTATE EVar2;
  int iVar3;
  FILE *__stream;
  string ret;
  string local_38;
  
  EVar2 = CClient::GetClientState(pClient);
  if ((int)EVar2 < 3) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"530 Please login with USER and PASS.\r\n","");
    CClient::sendMsg(pClient,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return -1;
    }
  }
  else {
    CClient::GetUserDir_abi_cxx11_(&local_38,pClient);
    chdir(local_38._M_dataplus._M_p);
    paVar1 = &local_38.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    __stream = fopen((this->super_CCommand).m_Args._M_dataplus._M_p,"rb");
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      iVar3 = remove((this->super_CCommand).m_Args._M_dataplus._M_p);
      if (iVar3 == 0) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"250 Delete operation successful.\r\n","");
        CClient::sendMsg(pClient,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != paVar1) {
          operator_delete(local_38._M_dataplus._M_p);
        }
        return 1;
      }
    }
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"550 Delete operation failed.\r\n","");
    CClient::sendMsg(pClient,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == paVar1) {
      return -1;
    }
  }
  operator_delete(local_38._M_dataplus._M_p);
  return -1;
}

Assistant:

int CDELECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        chdir(pClient->GetUserDir().c_str());
        FILE *file = fopen(m_Args.c_str(),"rb");
        if(file != NULL){
            fclose(file);
            if(0 == remove(m_Args.c_str())){
                string ret = "250 Delete operation successful.\r\n";
                pClient->sendMsg(ret);
                return 1;
            }
        }
        string ret = "550 Delete operation failed.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}